

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

size_t spdlog::details::os::filesize(FILE *f)

{
  int iVar1;
  FILE *in_RDI;
  stat64 st;
  int fd;
  int in_stack_ffffffffffffff0c;
  string *in_stack_ffffffffffffff10;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  size_t local_a0;
  
  if (in_RDI == (FILE *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    throw_spdlog_ex(in_stack_ffffffffffffff40);
  }
  iVar1 = fileno(in_RDI);
  iVar1 = fstat64(iVar1,(stat64 *)&stack0xffffffffffffff30);
  if (iVar1 == 0) {
    return local_a0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  __errno_location();
  throw_spdlog_ex(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
}

Assistant:

SPDLOG_INLINE size_t filesize(FILE *f) {
    if (f == nullptr) {
        throw_spdlog_ex("Failed getting file size. fd is null");
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
    int fd = ::_fileno(f);
    #if defined(_WIN64)  // 64 bits
    __int64 ret = ::_filelengthi64(fd);
    if (ret >= 0) {
        return static_cast<size_t>(ret);
    }

    #else  // windows 32 bits
    long ret = ::_filelength(fd);
    if (ret >= 0) {
        return static_cast<size_t>(ret);
    }
    #endif

#else  // unix
    // OpenBSD and AIX doesn't compile with :: before the fileno(..)
    #if defined(__OpenBSD__) || defined(_AIX)
    int fd = fileno(f);
    #else
    int fd = ::fileno(f);
    #endif
    // 64 bits(but not in osx, linux/musl or cygwin, where fstat64 is deprecated)
    #if ((defined(__linux__) && defined(__GLIBC__)) || defined(__sun) || defined(_AIX)) && \
        (defined(__LP64__) || defined(_LP64))
    struct stat64 st;
    if (::fstat64(fd, &st) == 0) {
        return static_cast<size_t>(st.st_size);
    }
    #else  // other unix or linux 32 bits or cygwin
    struct stat st;
    if (::fstat(fd, &st) == 0) {
        return static_cast<size_t>(st.st_size);
    }
    #endif
#endif
    throw_spdlog_ex("Failed getting file size from fd", errno);
    return 0;  // will not be reached.
}